

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O3

void Omega_h::inertia::recursively_bisect
               (CommPtr *comm,Real tolerance,Reals *p_coords,Reals *p_masses,Remotes *p_owners,
               Rib *p_hints)

{
  pointer __src;
  void **ppvVar1;
  int *piVar2;
  pointer __dest;
  Alloc *pAVar3;
  Comm *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Vector<3> axis_00;
  element_type *peVar4;
  void *pvVar5;
  Rib *p_hints_00;
  Alloc *this_01;
  I32 IVar6;
  uint uVar7;
  pointer pVVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  Vector<3> axis;
  Dist dist;
  element_type *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1f0;
  Dist local_1e8;
  Reals local_158;
  Reals local_148;
  CommPtr local_138;
  Remotes local_128;
  Vector<3> local_108;
  Rib *local_f0;
  Alloc *local_e8;
  void *local_e0;
  Reals local_d8;
  Dist local_c8;
  
  local_1e8.roots2items_[1].write_.shared_alloc_.alloc = (Alloc *)tolerance;
  IVar6 = Comm::size((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (IVar6 != 1) {
    __dest = (p_hints->axes).
             super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar8 = (p_hints->axes).
             super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_1e8.roots2items_[1].write_.shared_alloc_.direct_ptr = p_owners;
    local_f0 = p_hints;
    if (__dest == pVVar8) {
      local_138.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_138.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_138.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_138.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          )->_M_use_count =
               (local_138.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_138.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          )->_M_use_count =
               (local_138.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_148.write_.shared_alloc_.alloc = (p_coords->write_).shared_alloc_.alloc;
      if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
          local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_148.write_.shared_alloc_.alloc =
               (Alloc *)((local_148.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_148.write_.shared_alloc_.alloc)->use_count =
               (local_148.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      pAVar3 = local_148.write_.shared_alloc_.alloc;
      local_148.write_.shared_alloc_.direct_ptr = (p_coords->write_).shared_alloc_.direct_ptr;
      local_d8.write_.shared_alloc_.alloc = (p_masses->write_).shared_alloc_.alloc;
      if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
          local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_d8.write_.shared_alloc_.alloc =
               (Alloc *)((local_d8.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_d8.write_.shared_alloc_.alloc)->use_count =
               (local_d8.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      this_01 = local_d8.write_.shared_alloc_.alloc;
      local_d8.write_.shared_alloc_.direct_ptr = (p_masses->write_).shared_alloc_.direct_ptr;
      mark_bisection((inertia *)&local_c8,&local_138,&local_148,&local_d8,
                     (Real)local_1e8.roots2items_[1].write_.shared_alloc_.alloc,&local_108);
      local_1f8 = local_c8.parent_comm_.
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Stack_1f0 = local_c8.parent_comm_.
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((((ulong)local_c8.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 7) == 0 &&
           local_c8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) && (entering_parallel == '\x01')) {
        ppvVar1 = &((local_c8.parent_comm_.
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
        local_1f8 = (element_type *)
                    ((long)(local_c8.parent_comm_.
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           library_ * 8 + 1);
      }
      local_c8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_c8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (((ulong)this_01 & 7) == 0 && this_01 != (Alloc *)0x0) {
        piVar2 = &this_01->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(this_01);
          operator_delete(this_01,0x48);
        }
      }
      this_02._M_pi =
           local_138.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
        piVar2 = &pAVar3->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(pAVar3);
          operator_delete(pAVar3,0x48);
          this_02._M_pi =
               local_138.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
        }
      }
    }
    else {
      local_108.super_Few<double,_3>.array_[2] = (__dest->super_Few<double,_3>).array_[2];
      local_108.super_Few<double,_3>.array_[0] = (__dest->super_Few<double,_3>).array_[0];
      local_108.super_Few<double,_3>.array_[1] = (__dest->super_Few<double,_3>).array_[1];
      __src = __dest + 1;
      if (__src != pVVar8) {
        memmove(__dest,__src,(long)pVVar8 - (long)__src);
        pVVar8 = (p_hints->axes).
                 super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      (p_hints->axes).super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = pVVar8 + -1;
      local_158.write_.shared_alloc_.alloc =
           (Alloc *)(comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_158.write_.shared_alloc_.direct_ptr =
           (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.write_.shared_alloc_.direct_ptr
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.write_.shared_alloc_.direct_ptr
          )->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_158.write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.write_.shared_alloc_.direct_ptr
          )->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_158.write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
        }
      }
      local_1e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_coords->write_).shared_alloc_.alloc;
      if (((ulong)local_1e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr & 7) == 0 &&
          local_1e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (entering_parallel == '\x01') {
          local_1e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               ((long)(local_1e8.comm_[1].
                       super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      library_ * 8 + 1);
        }
        else {
          ppvVar1 = &((local_1e8.comm_[1].
                       super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     host_srcs_).read_.write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
        }
      }
      peVar4 = local_1e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_1e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (p_coords->write_).shared_alloc_.direct_ptr;
      local_e8 = (p_masses->write_).shared_alloc_.alloc;
      if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_e8 = (Alloc *)(local_e8->size * 8 + 1);
        }
        else {
          local_e8->use_count = local_e8->use_count + 1;
        }
      }
      pAVar3 = local_e8;
      local_e0 = (p_masses->write_).shared_alloc_.direct_ptr;
      axis_00.super_Few<double,_3>.array_[1] = local_108.super_Few<double,_3>.array_[1];
      axis_00.super_Few<double,_3>.array_[0] = local_108.super_Few<double,_3>.array_[0];
      axis_00.super_Few<double,_3>.array_[2] = local_108.super_Few<double,_3>.array_[2];
      mark_bisection_given_axis
                (&local_c8.parent_comm_,&local_158,(Reals *)(local_1e8.comm_ + 1),
                 (Real)local_1e8.roots2items_[1].write_.shared_alloc_.alloc,axis_00);
      local_1f8 = local_c8.parent_comm_.
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Stack_1f0 = local_c8.parent_comm_.
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((((ulong)local_c8.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 7) == 0 &&
           local_c8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) && (entering_parallel == '\x01')) {
        ppvVar1 = &((local_c8.parent_comm_.
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
        local_1f8 = (element_type *)
                    ((long)(local_c8.parent_comm_.
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           library_ * 8 + 1);
      }
      local_c8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_c8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
        piVar2 = &pAVar3->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(pAVar3);
          operator_delete(pAVar3,0x48);
        }
      }
      this_02._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.write_.shared_alloc_.direct_ptr
      ;
      if (((ulong)peVar4 & 7) == 0 && peVar4 != (element_type *)0x0) {
        ppvVar1 = &(peVar4->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
        if (*(int *)ppvVar1 == 0) {
          Alloc::~Alloc((Alloc *)peVar4);
          operator_delete(peVar4,0x48);
          this_02._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_158.write_.shared_alloc_.direct_ptr;
        }
      }
    }
    if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
    }
    local_1e8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_1e8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_1e8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1e8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_1e8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1e8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_1e8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_1e8.msgs2content_[1].write_.shared_alloc_.alloc = (Alloc *)local_1f8;
    if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (element_type *)0x0) {
      if (entering_parallel == '\x01') {
        local_1e8.msgs2content_[1].write_.shared_alloc_.alloc =
             (Alloc *)((long)local_1f8->library_ * 8 + 1);
      }
      else {
        ppvVar1 = &(local_1f8->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
      }
    }
    local_1e8.msgs2content_[1].write_.shared_alloc_.direct_ptr = p_Stack_1f0;
    bi_partition(&local_c8,local_1e8.comm_,(Read<signed_char> *)(local_1e8.msgs2content_ + 1));
    pAVar3 = local_1e8.msgs2content_[1].write_.shared_alloc_.alloc;
    pvVar5 = local_1e8.roots2items_[1].write_.shared_alloc_.direct_ptr;
    if (((ulong)local_1e8.msgs2content_[1].write_.shared_alloc_.alloc & 7) == 0 &&
        (element_type *)local_1e8.msgs2content_[1].write_.shared_alloc_.alloc != (element_type *)0x0
       ) {
      ppvVar1 = &(((HostRead<int> *)&(local_1e8.msgs2content_[1].write_.shared_alloc_.alloc)->ptr)->
                 read_).write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
      if (*(int *)ppvVar1 == 0) {
        Alloc::~Alloc(local_1e8.msgs2content_[1].write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    if (local_1e8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_1e8.msgs2content_[0].write_.shared_alloc_.alloc = (p_coords->write_).shared_alloc_.alloc;
    if (((ulong)local_1e8.msgs2content_[0].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1e8.msgs2content_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1e8.msgs2content_[0].write_.shared_alloc_.alloc =
             (Alloc *)((local_1e8.msgs2content_[0].write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1e8.msgs2content_[0].write_.shared_alloc_.alloc)->use_count =
             (local_1e8.msgs2content_[0].write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1e8.msgs2content_[0].write_.shared_alloc_.direct_ptr =
         (p_coords->write_).shared_alloc_.direct_ptr;
    Dist::exch<double>(&local_1e8,(Read<double> *)&local_c8,(int)&local_1e8 + 0x50);
    pAVar3 = (p_coords->write_).shared_alloc_.alloc;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar2 = &pAVar3->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_1e8.msgs2content_[0].write_.shared_alloc_.alloc;
    (p_coords->write_).shared_alloc_.alloc =
         (Alloc *)local_1e8.parent_comm_.
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (p_coords->write_).shared_alloc_.direct_ptr =
         local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((((ulong)local_1e8.parent_comm_.
                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 7) == 0 &&
         local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         != (element_type *)0x0) && (entering_parallel == '\x01')) {
      ppvVar1 = &((local_1e8.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->host_srcs_
                 ).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
      (p_coords->write_).shared_alloc_.alloc =
           (Alloc *)((long)(local_1e8.parent_comm_.
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           library_ * 8 + 1);
    }
    local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (((ulong)local_1e8.msgs2content_[0].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1e8.msgs2content_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar2 = &(local_1e8.msgs2content_[0].write_.shared_alloc_.alloc)->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_1e8.msgs2content_[0].write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_1e8.items2content_[1].write_.shared_alloc_.alloc = (p_masses->write_).shared_alloc_.alloc;
    if (((ulong)local_1e8.items2content_[1].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1e8.items2content_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1e8.items2content_[1].write_.shared_alloc_.alloc =
             (Alloc *)((local_1e8.items2content_[1].write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1e8.items2content_[1].write_.shared_alloc_.alloc)->use_count =
             (local_1e8.items2content_[1].write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1e8.items2content_[1].write_.shared_alloc_.direct_ptr =
         (p_masses->write_).shared_alloc_.direct_ptr;
    Dist::exch<double>(&local_1e8,(Read<double> *)&local_c8,(int)&local_1e8 + 0x40);
    pAVar3 = (p_masses->write_).shared_alloc_.alloc;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar2 = &pAVar3->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_1e8.items2content_[1].write_.shared_alloc_.alloc;
    (p_masses->write_).shared_alloc_.alloc =
         (Alloc *)local_1e8.parent_comm_.
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (p_masses->write_).shared_alloc_.direct_ptr =
         local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((((ulong)local_1e8.parent_comm_.
                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 7) == 0 &&
         local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         != (element_type *)0x0) && (entering_parallel == '\x01')) {
      ppvVar1 = &((local_1e8.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->host_srcs_
                 ).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
      (p_masses->write_).shared_alloc_.alloc =
           (Alloc *)((long)(local_1e8.parent_comm_.
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           library_ * 8 + 1);
    }
    local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (((ulong)local_1e8.items2content_[1].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1e8.items2content_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar2 = &(local_1e8.items2content_[1].write_.shared_alloc_.alloc)->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_1e8.items2content_[1].write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_128.ranks.write_.shared_alloc_.alloc = (((Read<int> *)pvVar5)->write_).shared_alloc_.alloc
    ;
    if (((ulong)local_128.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
        local_128.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_128.ranks.write_.shared_alloc_.alloc =
             (Alloc *)((local_128.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_128.ranks.write_.shared_alloc_.alloc)->use_count =
             (local_128.ranks.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_128.ranks.write_.shared_alloc_.direct_ptr =
         (((Read<int> *)pvVar5)->write_).shared_alloc_.direct_ptr;
    local_128.idxs.write_.shared_alloc_.alloc =
         (((LOs *)((long)pvVar5 + 0x10))->write_).shared_alloc_.alloc;
    if (((ulong)local_128.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
        local_128.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_128.idxs.write_.shared_alloc_.alloc =
             (Alloc *)((local_128.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_128.idxs.write_.shared_alloc_.alloc)->use_count =
             (local_128.idxs.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_128.idxs.write_.shared_alloc_.direct_ptr =
         (((LOs *)((long)pvVar5 + 0x10))->write_).shared_alloc_.direct_ptr;
    Dist::exch((Remotes *)&local_1e8,&local_c8,&local_128,1);
    Remotes::operator=((Remotes *)pvVar5,(Remotes *)&local_1e8);
    if (((ulong)local_1e8.roots2items_[0].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1e8.roots2items_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar2 = &(local_1e8.roots2items_[0].write_.shared_alloc_.alloc)->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_1e8.roots2items_[0].write_.shared_alloc_.alloc);
        operator_delete(local_1e8.roots2items_[0].write_.shared_alloc_.alloc,0x48);
      }
    }
    peVar4 = local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (((ulong)local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr & 7) == 0 &&
        local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      ppvVar1 = &((local_1e8.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->host_srcs_
                 ).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
      if (*(int *)ppvVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_1e8.parent_comm_.
                               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
        operator_delete(peVar4,0x48);
      }
    }
    pAVar3 = local_128.idxs.write_.shared_alloc_.alloc;
    if (((ulong)local_128.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
        local_128.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar2 = &(local_128.idxs.write_.shared_alloc_.alloc)->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_128.idxs.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_128.ranks.write_.shared_alloc_.alloc;
    if (((ulong)local_128.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
        local_128.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar2 = &(local_128.ranks.write_.shared_alloc_.alloc)->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(local_128.ranks.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    uVar7 = Comm::size((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    if ((uVar7 & 1) != 0) {
      fail("assertion %s failed at %s +%d\n","a % b == 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
           ,0x11a);
    }
    this = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    IVar6 = Comm::rank(this);
    Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    Comm::split((Comm *)&local_1e8,(I32)this,IVar6 / ((int)uVar7 >> 1));
    p_hints_00 = local_f0;
    pvVar5 = local_1e8.roots2items_[1].write_.shared_alloc_.direct_ptr;
    local_1e8.items2content_[0].write_.shared_alloc_.direct_ptr =
         local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    peVar4 = local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar4;
    this_00 = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_1e8.items2content_[0].write_.shared_alloc_.direct_ptr;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (local_1e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e8.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      local_1e8.items2content_[0].write_.shared_alloc_.direct_ptr =
           (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    }
    local_1e8.items2content_[0].write_.shared_alloc_.alloc =
         (Alloc *)(comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_1e8.items2content_[0].write_.shared_alloc_.direct_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_1e8.items2content_[0].write_.shared_alloc_.direct_ptr)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_1e8.items2content_[0].write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_1e8.items2content_[0].write_.shared_alloc_.direct_ptr)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_1e8.items2content_[0].write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
      }
    }
    recursively_bisect((CommPtr *)local_1e8.items2content_,
                       (Real)local_1e8.roots2items_[1].write_.shared_alloc_.alloc,p_coords,p_masses,
                       (Remotes *)pvVar5,p_hints_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_1e8.items2content_[0].write_.shared_alloc_.direct_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_1e8.items2content_[0].write_.shared_alloc_.direct_ptr);
    }
    std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::insert
              (&p_hints_00->axes,
               (p_hints_00->axes).
               super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
               super__Vector_impl_data._M_start,&local_108);
    Dist::~Dist(&local_c8);
    if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (element_type *)0x0) {
      ppvVar1 = &(local_1f8->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
      if (*(int *)ppvVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_1f8);
        operator_delete(local_1f8,0x48);
      }
    }
  }
  return;
}

Assistant:

void recursively_bisect(CommPtr comm, Real tolerance, Reals* p_coords,
    Reals* p_masses, Remotes* p_owners, Rib* p_hints) {
  auto& coords = *p_coords;
  auto& masses = *p_masses;
  auto& owners = *p_owners;
  auto& hints = *p_hints;
  if (comm->size() == 1) {
    return;
  }
  Vector<3> axis;
  Read<I8> marks;
  if (hints.axes.empty()) {
    marks = inertia::mark_bisection(comm, coords, masses, tolerance, axis);
  } else {
    axis = hints.axes.front();
    hints.axes.erase(hints.axes.begin());
    marks = inertia::mark_bisection_given_axis(
        comm, coords, masses, tolerance, axis);
  }
  auto dist = bi_partition(comm, marks);
  coords = dist.exch(coords, 3);
  masses = dist.exch(masses, 1);
  owners = dist.exch(owners, 1);
  auto halfsize = divide_no_remainder(comm->size(), 2);
  comm = comm->split(comm->rank() / halfsize, comm->rank() % halfsize);
  recursively_bisect(comm, tolerance, p_coords, p_masses, p_owners, p_hints);
  hints.axes.insert(hints.axes.begin(), axis);
}